

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lru_cache.hpp
# Opt level: O0

void __thiscall
cappuccino::
lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
::do_insert(lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
            *this,unsigned_long *key,
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  ulong uVar1;
  size_type sVar2;
  reference puVar3;
  reference e_00;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>,_bool>
  pVar4;
  element *e;
  _Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false> keyed_position;
  unsigned_long element_idx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  unsigned_long *key_local;
  lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  
  uVar1 = *(ulong *)(this + 0x28);
  sVar2 = std::
          vector<cappuccino::lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>::element,_std::allocator<cappuccino::lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>::element>_>
          ::size((vector<cappuccino::lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>::element,_std::allocator<cappuccino::lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>::element>_>
                  *)(this + 0x30));
  if (sVar2 <= uVar1) {
    do_prune(this);
  }
  puVar3 = std::_List_iterator<unsigned_long>::operator*
                     ((_List_iterator<unsigned_long> *)(this + 0x98));
  keyed_position.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
  _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)*puVar3;
  pVar4 = std::
          unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
          ::emplace<unsigned_long_const&,unsigned_long&>
                    ((unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                      *)(this + 0x48),key,(unsigned_long *)&keyed_position);
  e_00 = std::
         vector<cappuccino::lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>::element,_std::allocator<cappuccino::lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>::element>_>
         ::operator[]((vector<cappuccino::lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>::element,_std::allocator<cappuccino::lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>::element>_>
                       *)(this + 0x30),
                      (size_type)
                      keyed_position.
                      super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                      ._M_cur);
  std::__cxx11::string::operator=((string *)&e_00->m_value,(string *)value);
  (e_00->m_lru_position)._M_node = *(_List_node_base **)(this + 0x98);
  (e_00->m_keyed_position).
  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
       (__node_type *)
       pVar4.first.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
       _M_cur.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>;
  std::_List_iterator<unsigned_long>::operator++((_List_iterator<unsigned_long> *)(this + 0x98));
  *(long *)(this + 0x28) = *(long *)(this + 0x28) + 1;
  do_access(this,e_00);
  return;
}

Assistant:

auto do_insert(const key_type& key, value_type&& value) -> void
    {
        if (m_used_size >= m_elements.size())
        {
            do_prune();
        }

        auto element_idx = *m_lru_end;

        auto keyed_position = m_keyed_elements.emplace(key, element_idx).first;

        element& e         = m_elements[element_idx];
        e.m_value          = std::move(value);
        e.m_lru_position   = m_lru_end;
        e.m_keyed_position = keyed_position;

        ++m_lru_end;

        ++m_used_size;

        // This is the most recently used item, put it in the appropriate place.
        do_access(e);
    }